

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O2

void __thiscall
duckdb::DataChunk::ReferenceColumns
          (DataChunk *this,DataChunk *other,vector<unsigned_long,_true> *column_ids)

{
  const_reference pvVar1;
  reference other_00;
  reference this_00;
  idx_t col_idx;
  ulong __n;
  
  Reset(this);
  for (__n = 0; __n < (ulong)(((long)(this->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    pvVar1 = vector<unsigned_long,_true>::get<true>(column_ids,__n);
    other_00 = vector<duckdb::Vector,_true>::get<true>(&other->data,*pvVar1);
    this_00 = vector<duckdb::Vector,_true>::get<true>(&this->data,__n);
    Vector::Reference(this_00,other_00);
  }
  this->count = other->count;
  return;
}

Assistant:

void DataChunk::ReferenceColumns(DataChunk &other, const vector<column_t> &column_ids) {
	D_ASSERT(ColumnCount() == column_ids.size());
	Reset();
	for (idx_t col_idx = 0; col_idx < ColumnCount(); col_idx++) {
		auto &other_col = other.data[column_ids[col_idx]];
		auto &this_col = data[col_idx];
		D_ASSERT(other_col.GetType() == this_col.GetType());
		this_col.Reference(other_col);
	}
	SetCardinality(other.size());
}